

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt)

{
  xmlRegStatePtr *ppxVar1;
  xmlRegAtomPtr *ppxVar2;
  long lVar3;
  
  if (ctxt->string != (xmlChar *)0x0) {
    (*xmlFree)(ctxt->string);
  }
  ppxVar1 = ctxt->states;
  if (ppxVar1 != (xmlRegStatePtr *)0x0) {
    if (0 < ctxt->nbStates) {
      lVar3 = 0;
      do {
        xmlRegFreeState(ctxt->states[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < ctxt->nbStates);
      ppxVar1 = ctxt->states;
    }
    (*xmlFree)(ppxVar1);
  }
  ppxVar2 = ctxt->atoms;
  if (ppxVar2 != (xmlRegAtomPtr *)0x0) {
    if (0 < ctxt->nbAtoms) {
      lVar3 = 0;
      do {
        xmlRegFreeAtom(ctxt->atoms[lVar3]);
        lVar3 = lVar3 + 1;
      } while (lVar3 < ctxt->nbAtoms);
      ppxVar2 = ctxt->atoms;
    }
    (*xmlFree)(ppxVar2);
  }
  if (ctxt->counters != (xmlRegCounter *)0x0) {
    (*xmlFree)(ctxt->counters);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

static void
xmlRegFreeParserCtxt(xmlRegParserCtxtPtr ctxt) {
    int i;
    if (ctxt == NULL)
	return;

    if (ctxt->string != NULL)
	xmlFree(ctxt->string);
    if (ctxt->states != NULL) {
	for (i = 0;i < ctxt->nbStates;i++)
	    xmlRegFreeState(ctxt->states[i]);
	xmlFree(ctxt->states);
    }
    if (ctxt->atoms != NULL) {
	for (i = 0;i < ctxt->nbAtoms;i++)
	    xmlRegFreeAtom(ctxt->atoms[i]);
	xmlFree(ctxt->atoms);
    }
    if (ctxt->counters != NULL)
	xmlFree(ctxt->counters);
    xmlFree(ctxt);
}